

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cxxopts.hpp
# Opt level: O0

basic_string<char,_std::char_traits<char>,_std::allocator<char>_> * __thiscall
cxxopts::OptionValue::as<std::__cxx11::string>(OptionValue *this)

{
  long lVar1;
  bool bVar2;
  element_type *peVar3;
  abstract_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar4;
  long *in_RDI;
  nullptr_t in_stack_ffffffffffffffa8;
  __shared_ptr_access<cxxopts::Value,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  *in_stack_ffffffffffffffb0;
  string *in_stack_ffffffffffffffc0;
  bool local_2a;
  __shared_ptr_access<cxxopts::Value,_(__gnu_cxx::_Lock_policy)2,_false,_false> local_29;
  string local_28 [8];
  allocator<char> *in_stack_ffffffffffffffe0;
  char *in_stack_ffffffffffffffe8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffff0;
  
  bVar2 = std::operator==((shared_ptr<cxxopts::Value> *)in_stack_ffffffffffffffb0,
                          in_stack_ffffffffffffffa8);
  if (bVar2) {
    lVar1 = *in_RDI;
    if (lVar1 != 0) {
      std::__cxx11::string::string(local_28,(string *)*in_RDI);
    }
    else {
      in_stack_ffffffffffffffb0 = &local_29;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffffff0,in_stack_ffffffffffffffe8,in_stack_ffffffffffffffe0);
    }
    local_2a = lVar1 == 0;
    throw_or_mimic<cxxopts::option_has_no_value_exception>(in_stack_ffffffffffffffc0);
    std::__cxx11::string::~string(local_28);
    if (local_2a) {
      std::allocator<char>::~allocator((allocator<char> *)&local_29);
    }
  }
  peVar3 = std::__shared_ptr_access<cxxopts::Value,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator*(in_stack_ffffffffffffffb0);
  this_00 = (abstract_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)__dynamic_cast(peVar3,&Value::typeinfo,
                              &values::standard_value<std::__cxx11::string>::typeinfo,0);
  if (this_00 !=
      (abstract_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
       *)0x0) {
    pbVar4 = values::
             abstract_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::get(this_00);
    return pbVar4;
  }
  __cxa_bad_cast();
}

Assistant:

const T&
    as() const
    {
      if (m_value == nullptr) {
          throw_or_mimic<option_has_no_value_exception>(
              m_long_name == nullptr ? "" : *m_long_name);
      }

#ifdef CXXOPTS_NO_RTTI
      return static_cast<const values::standard_value<T>&>(*m_value).get();
#else
      return dynamic_cast<const values::standard_value<T>&>(*m_value).get();
#endif
    }